

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O2

void __thiscall tonk::SDKConnection::~SDKConnection(SDKConnection *this)

{
  this->_vptr_SDKConnection = (_func_int **)&PTR__SDKConnection_0010ac50;
  if (this->MyConnection != (TonkConnection)0x0) {
    if (fp_tonk_free != (fp_tonk_free_t)0x0) {
      (*fp_tonk_free)(this->MyConnection);
    }
    this->MyConnection = (TonkConnection)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->SelfReference).
              super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<tonk::SDKConnection>)._M_weak_this.
              super___weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

SDKConnection::~SDKConnection()
{
    if (MyConnection != nullptr)
    {
        tonk_free(MyConnection);
        MyConnection = nullptr;
    }
}